

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::iterator::operator*(iterator *this)

{
  code *pcVar1;
  ctrl_t *__dest;
  reference extraout_RAX;
  reference extraout_RAX_00;
  reference ppVar2;
  code *in_RCX;
  undefined4 *puVar3;
  long extraout_RDX;
  undefined8 *unaff_RBX;
  ctrl_t *in_RSI;
  char *pcVar4;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *unaff_R12;
  undefined8 *unaff_R14;
  slot_type *__n;
  undefined8 *unaff_R15;
  string_view data;
  char *pcStack_100;
  size_t sStack_f8;
  char cStack_f0;
  undefined7 uStack_ef;
  Output *pOStack_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  slot_type *psStack_30;
  
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    in_RCX = std::__cxx11::string::_M_create;
    if (pcVar1 != std::__cxx11::string::_M_create) {
      if (-1 < (char)*pcVar1) {
        return (reference)(this->field_1).slot_;
      }
      goto LAB_00115da0;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::iterator::operator*((iterator *)this);
LAB_00115da0:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::iterator::operator*((iterator *)this);
  puVar3 = (undefined4 *)
           CONCAT71((int7)((ulong)in_RCX >> 8),extraout_RDX == 0 || in_RSI != (ctrl_t *)0x0);
  if (extraout_RDX == 0 || in_RSI != (ctrl_t *)0x0) {
    __n = (slot_type *)(extraout_RDX - (long)in_RSI);
    psStack_30 = __n;
    if (__n < (slot_type *)0x10) {
      __dest = this->ctrl_;
    }
    else {
      __dest = (ctrl_t *)std::__cxx11::string::_M_create((ulong *)this,(ulong)&psStack_30);
      this->ctrl_ = __dest;
      this[1].ctrl_ = (ctrl_t *)psStack_30;
    }
    if (__n != (slot_type *)0x0) {
      if (__n == (slot_type *)0x1) {
        *__dest = *in_RSI;
      }
      else {
        memcpy(__dest,in_RSI,(size_t)__n);
      }
    }
    (this->field_1).slot_ = psStack_30;
    this->ctrl_[(long)psStack_30] = ~kSentinel;
    return (reference)psStack_30;
  }
  pcVar4 = anon_var_dwarf_dc;
  std::__throw_logic_error(anon_var_dwarf_dc);
  uStack_d8 = *puVar3;
  uStack_d4 = puVar3[1];
  uStack_d0 = puVar3[2];
  uStack_cc = puVar3[3];
  uStack_c0 = *in_R8;
  uStack_c8 = in_R8[1];
  uStack_b0 = *in_R9;
  uStack_b8 = in_R9[1];
  uStack_a0 = *unaff_RBX;
  uStack_a8 = unaff_RBX[1];
  uStack_90 = *unaff_R12;
  uStack_98 = unaff_R12[1];
  uStack_80 = *unaff_R14;
  uStack_88 = unaff_R14[1];
  uStack_70 = *unaff_R15;
  uStack_78 = unaff_R15[1];
  sStack_f8 = 0;
  cStack_f0 = '\0';
  pcStack_100 = &cStack_f0;
  pOStack_e0 = (Output *)pcVar4;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray(&pcStack_100);
  data._M_str = pcStack_100;
  data._M_len = sStack_f8;
  upb::generator::Output::Write(pOStack_e0,data);
  ppVar2 = extraout_RAX;
  if (pcStack_100 != &cStack_f0) {
    operator_delete(pcStack_100,CONCAT71(uStack_ef,cStack_f0) + 1);
    ppVar2 = extraout_RAX_00;
  }
  return ppVar2;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }